

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  internal *piVar5;
  TestResult *this;
  TestInfo *pTVar6;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *result;
  int local_284;
  undefined1 local_280 [4];
  int i;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  int local_17c;
  string local_178;
  allocator<char> local_151;
  string local_150;
  int local_12c;
  string local_128;
  allocator<char> local_101;
  string local_100;
  int local_dc;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string kTestsuite;
  TestSuite *test_suite_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = test_suite;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"testsuite",&local_39);
  std::allocator<char>::~allocator(&local_39);
  poVar3 = std::operator<<(stream,"  <");
  std::operator<<(poVar3,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"name",&local_61);
  pcVar4 = TestSuite::name((TestSuite *)kTestsuite.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar4,&local_89);
  OutputXmlAttribute(stream,(string *)local_38,&local_60,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"tests",&local_b1);
  local_dc = TestSuite::reportable_test_count((TestSuite *)kTestsuite.field_2._8_8_);
  StreamableToString<int>(&local_d8,&local_dc);
  OutputXmlAttribute(stream,(string *)local_38,&local_b0,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"failures",&local_101);
    local_12c = TestSuite::failed_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    StreamableToString<int>(&local_128,&local_12c);
    OutputXmlAttribute(stream,(string *)local_38,&local_100,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"disabled",&local_151);
    local_17c = TestSuite::reportable_disabled_test_count((TestSuite *)kTestsuite.field_2._8_8_);
    StreamableToString<int>(&local_178,&local_17c);
    OutputXmlAttribute(stream,(string *)local_38,&local_150,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"errors",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"0",&local_1c9);
    OutputXmlAttribute(stream,(string *)local_38,&local_1a0,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"time",&local_1f1);
    piVar5 = (internal *)TestSuite::elapsed_time((TestSuite *)kTestsuite.field_2._8_8_);
    FormatTimeInMillisAsSeconds_abi_cxx11_(&local_218,piVar5,ms);
    OutputXmlAttribute(stream,(string *)local_38,&local_1f0,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"timestamp",&local_239);
    piVar5 = (internal *)TestSuite::start_timestamp((TestSuite *)kTestsuite.field_2._8_8_);
    FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_260,piVar5,ms_00);
    OutputXmlAttribute(stream,(string *)local_38,&local_238,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    this = TestSuite::ad_hoc_test_result((TestSuite *)kTestsuite.field_2._8_8_);
    TestPropertiesAsXmlAttributes_abi_cxx11_
              ((string *)local_280,(XmlUnitTestResultPrinter *)this,result);
    std::operator<<(stream,(string *)local_280);
    std::__cxx11::string::~string((string *)local_280);
  }
  std::operator<<(stream,">\n");
  for (local_284 = 0; iVar2 = TestSuite::total_test_count((TestSuite *)kTestsuite.field_2._8_8_),
      local_284 < iVar2; local_284 = local_284 + 1) {
    pTVar6 = TestSuite::GetTestInfo((TestSuite *)kTestsuite.field_2._8_8_,local_284);
    bVar1 = TestInfo::is_reportable(pTVar6);
    if (bVar1) {
      pcVar4 = TestSuite::name((TestSuite *)kTestsuite.field_2._8_8_);
      pTVar6 = TestSuite::GetTestInfo((TestSuite *)kTestsuite.field_2._8_8_,local_284);
      OutputXmlTestInfo(stream,pcVar4,pTVar6);
    }
  }
  poVar3 = std::operator<<(stream,"  </");
  poVar3 = std::operator<<(poVar3,(string *)local_38);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestSuite(std::ostream* stream,
                                                 const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_suite.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_suite.reportable_test_count()));
  if (!GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_suite.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_suite.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "errors", "0");
    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_suite.elapsed_time()));
    OutputXmlAttribute(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsIso8601(test_suite.start_timestamp()));
    *stream << TestPropertiesAsXmlAttributes(test_suite.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}